

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall
spvtools::opt::operator<<::anon_class_8_1_ba1d7991::operator()
          (anon_class_8_1_ba1d7991 *this,Instruction *inst)

{
  Op OVar1;
  Instruction *inst_local;
  anon_class_8_1_ba1d7991 *this_local;
  
  opt::operator<<(this->str,inst);
  OVar1 = Instruction::opcode(inst);
  if (OVar1 != OpFunctionEnd) {
    std::ostream::operator<<(this->str,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Module& module) {
  module.ForEachInst([&str](const Instruction* inst) {
    str << *inst;
    if (inst->opcode() != spv::Op::OpFunctionEnd) {
      str << std::endl;
    }
  });
  return str;
}